

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int lj_cf_ffi_meta___tostring(lua_State *L)

{
  ushort uVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  CType *pCVar4;
  uint32_t uVar5;
  GCstr *pGVar6;
  ulong uVar7;
  cTValue *tv;
  uint uVar8;
  uint id;
  CType *pCVar9;
  CTState *cts;
  uint64_t *puVar10;
  uint64_t *sp;
  char *fmt;
  char cVar11;
  
  pTVar2 = L->base;
  pTVar3 = L->top;
  if ((pTVar3 <= pTVar2) || ((pTVar2->field_2).it != 0xfffffff5)) {
    lj_err_argt(L,1,10);
  }
  uVar1 = *(ushort *)((ulong)(pTVar2->u32).lo + 6);
  id = (uint)uVar1;
  sp = (uint64_t *)((ulong)(pTVar2->u32).lo + 8);
  uVar8 = (uint)uVar1;
  if (uVar8 == 0x15) {
    id = *(uint *)sp;
    fmt = "ctype<%s>";
  }
  else {
    cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
    cts->L = L;
    pCVar4 = cts->tab;
    pCVar9 = pCVar4 + uVar8;
    puVar10 = sp;
    if ((pCVar4[uVar8].info & 0xf0800000) == 0x20800000) {
      pCVar9 = pCVar4 + (ushort)pCVar9->info;
      puVar10 = (uint64_t *)*sp;
    }
    uVar8 = pCVar9->info;
    if ((uVar8 & 0xf4000000) == 0x34000000) {
      pGVar6 = lj_ctype_repr_complex(L,sp,pCVar9->size);
      uVar5 = (uint32_t)pGVar6;
LAB_00125c6a:
      pTVar3[-1].u32.lo = uVar5;
      *(undefined4 *)((long)pTVar3 - 4) = 0xfffffffb;
      cVar11 = '\x02';
      fmt = "cdata<%s>: %p";
      sp = puVar10;
    }
    else {
      if (uVar8 < 0x4000000 && pCVar9->size == 8) {
        pGVar6 = lj_ctype_repr_int64(L,*sp,uVar8 & 0x800000);
        uVar5 = (uint32_t)pGVar6;
        goto LAB_00125c6a;
      }
      uVar8 = uVar8 >> 0x1c;
      if (uVar8 == 2) {
        if (pCVar9->size == 4) {
          sp = (uint64_t *)(ulong)(uint)*puVar10;
        }
        else {
          sp = (uint64_t *)*puVar10;
        }
        pCVar9 = pCVar4 + (ushort)pCVar9->info;
LAB_00125d31:
        fmt = "cdata<%s>: %p";
        if ((pCVar9->info & 0xf0000000) == 0x10000000 || (pCVar9->info & 0xf8000000) == 0x38000000)
        {
          tv = lj_ctype_meta(cts,(CTypeID)((ulong)((long)pCVar9 - (long)pCVar4) >> 4),MM_tostring);
          if (tv != (cTValue *)0x0) {
            uVar8 = lj_meta_tailcall(L,tv);
            puVar10 = (uint64_t *)(ulong)uVar8;
          }
          cVar11 = tv != (cTValue *)0x0;
        }
        else {
          cVar11 = '\0';
        }
      }
      else if (uVar8 == 5) {
        sp = (uint64_t *)(ulong)(uint)*puVar10;
        cVar11 = '\0';
        fmt = "cdata<%s>: %d";
      }
      else {
        sp = puVar10;
        if (uVar8 != 6) goto LAB_00125d31;
        sp = (uint64_t *)*puVar10;
        cVar11 = '\0';
        fmt = "cdata<%s>: %p";
      }
    }
    if (cVar11 == '\x02') goto LAB_00125cae;
    if (cVar11 != '\0') {
      return (int)puVar10;
    }
  }
  pGVar6 = lj_ctype_repr(L,id,(GCstr *)0x0);
  lj_strfmt_pushf(L,fmt,pGVar6 + 1,sp);
LAB_00125cae:
  uVar7 = (ulong)(L->glref).ptr32;
  if (*(uint *)(uVar7 + 0x54) <= *(uint *)(uVar7 + 0x50)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_meta___tostring)
{
  GCcdata *cd = ffi_checkcdata(L, 1);
  const char *msg = "cdata<%s>: %p";
  CTypeID id = cd->ctypeid;
  void *p = cdataptr(cd);
  if (id == CTID_CTYPEID) {
    msg = "ctype<%s>";
    id = *(CTypeID *)p;
  } else {
    CTState *cts = ctype_cts(L);
    CType *ct = ctype_raw(cts, id);
    if (ctype_isref(ct->info)) {
      p = *(void **)p;
      ct = ctype_rawchild(cts, ct);
    }
    if (ctype_iscomplex(ct->info)) {
      setstrV(L, L->top-1, lj_ctype_repr_complex(L, cdataptr(cd), ct->size));
      goto checkgc;
    } else if (ct->size == 8 && ctype_isinteger(ct->info)) {
      setstrV(L, L->top-1, lj_ctype_repr_int64(L, *(uint64_t *)cdataptr(cd),
					       (ct->info & CTF_UNSIGNED)));
      goto checkgc;
    } else if (ctype_isfunc(ct->info)) {
      p = *(void **)p;
    } else if (ctype_isenum(ct->info)) {
      msg = "cdata<%s>: %d";
      p = (void *)(uintptr_t)*(uint32_t *)p;
    } else {
      if (ctype_isptr(ct->info)) {
	p = cdata_getptr(p, ct->size);
	ct = ctype_rawchild(cts, ct);
      }
      if (ctype_isstruct(ct->info) || ctype_isvector(ct->info)) {
	/* Handle ctype __tostring metamethod. */
	cTValue *tv = lj_ctype_meta(cts, ctype_typeid(cts, ct), MM_tostring);
	if (tv)
	  return lj_meta_tailcall(L, tv);
      }
    }
  }
  lj_strfmt_pushf(L, msg, strdata(lj_ctype_repr(L, id, NULL)), p);
checkgc:
  lj_gc_check(L);
  return 1;
}